

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::
SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_zero_Test::TestBody
          (SubjectFactoryTest_test_fx_spot_stream_Quantity_must_not_be_zero_Test *this)

{
  string *psVar1;
  undefined8 *puVar2;
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  AssertHelper local_110 [4];
  string local_f0 [32];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  string local_78 [32];
  string local_58 [32];
  undefined8 local_38;
  SubjectFactory subject_factory;
  string local_28 [24];
  
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(&subject_factory,USER_INFO);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_38 = bidfx_public_api::price::subject::SubjectFactory::FX::Quote();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Spot();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"EURGBP",&local_111);
  psVar1 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Spot::CurrencyPair(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"EUR",&local_112);
  bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Currency(psVar1);
  psVar1 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Spot::Quantity(0.0);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"CSFX",&local_113);
  puVar2 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Spot::LiquidityProvider(psVar1);
  (**(code **)*puVar2)(&local_90,puVar2);
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  std::__cxx11::string::~string((string *)local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_f0);
  SubjectFactory::MandatoryFieldsSubjectCreator::~MandatoryFieldsSubjectCreator
            ((MandatoryFieldsSubjectCreator *)&gtest_ar);
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (local_110,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_factory_test.cpp"
             ,0xc5,"Failed");
  testing::internal::AssertHelper::operator=(local_110,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(local_110);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  return;
}

Assistant:

TEST(SubjectFactoryTest, test_fx_spot_stream_Quantity_must_not_be_zero)
{
    SubjectFactory subject_factory = SubjectFactory(USER_INFO);

    try
    {
        subject_factory.Fx().Quote().Spot()
                .CurrencyPair("EURGBP")
                .Currency("EUR")
                .Quantity(0)
                .LiquidityProvider("CSFX")
                .CreateSubject()
                .ToString().c_str();
    }
    catch (InvalidSubjectException& e)
    {
        ASSERT_STREQ(e.what(), "dealt quantity must be a positive value: 0.00");
        return;
    }

    FAIL();
}